

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

int __thiscall
Indexing::CodeTree::RemovingMatcher<false>::init(RemovingMatcher<false> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  size_t in_RCX;
  LitInfo *in_RDX;
  CodeTree *in_R8;
  Stack<Indexing::CodeTree::CodeOp_*> *in_R9;
  
  this->fresh = true;
  this->entry = (CodeOp *)ctx;
  this->linfos = in_RDX;
  this->linfoCnt = in_RCX;
  this->tree = in_R8;
  this->firstsInBlocks = in_R9;
  this->initFIBDepth = (long)in_R9->_cursor - (long)in_R9->_stack >> 3;
  this->matchingClauses = in_R8->_clauseCodeTree;
  ::Lib::DArray<unsigned_int>::ensure(&this->bindings,(ulong)in_R8->_maxVarCnt);
  (this->btStack)._cursor = (this->btStack)._stack;
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&(this->range)._map);
  this->curLInfo = 0;
  return extraout_EAX;
}

Assistant:

void CodeTree::RemovingMatcher<checkRange>::init(CodeOp* entry_, LitInfo* linfos_,
    size_t linfoCnt_, CodeTree* tree_, Stack<CodeOp*>* firstsInBlocks_)
{
  fresh=true;
  entry=entry_;
  linfos=linfos_;
  linfoCnt=linfoCnt_;
  tree=tree_;
  firstsInBlocks=firstsInBlocks_;

  initFIBDepth=firstsInBlocks->size();

  matchingClauses=tree->_clauseCodeTree;
  bindings.ensure(tree->_maxVarCnt);
  btStack.reset();
  range.reset();

  curLInfo=0;
}